

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O1

void __thiscall CircBufTest::CircBufTest(CircBufTest *this,int test_id)

{
  char *pcVar1;
  char name [32];
  char local_58 [40];
  
  TestCase::TestCase(&this->super_TestCase,"CircBuf");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR__CircBufTest_0010ac80;
  this->mTest = test_id;
  JetHead::CircularBuffer::CircularBuffer(&this->gbuff,0x80);
  Condition::Condition(&this->gbuff_cond);
  Mutex::Mutex(&this->gbuff_mutex,false);
  sprintf(local_58,"Circular Buffer Test %d",test_id);
  pcVar1 = (char *)(this->super_TestCase).mTestName._M_string_length;
  strlen(local_58);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_TestCase).mTestName,0,pcVar1,(ulong)local_58);
  return;
}

Assistant:

CircBufTest::CircBufTest(int test_id)
		: TestCase("CircBuf"), mTest(test_id), gbuff(BUFFER_SIZE)
{

	char name[32];

	sprintf( name, "Circular Buffer Test %d", test_id);

	SetTestName( name );

}